

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O0

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::string_helper::
write<pstore::serialize::archive::database_writer&,pstore::sstring_view<std::shared_ptr<char_const>>>
          (database_writer *archive,sstring_view<std::shared_ptr<const_char>_> *str)

{
  iterator out;
  uchar *puVar1;
  uchar *puVar2;
  archive_result_type<pstore::serialize::archive::database_writer_&> aVar3;
  span<unsigned_char,__1L> sVar4;
  span<const_char,__1L> sVar5;
  extent_type<_1L> local_70;
  extent_type<_1L> local_68;
  extent_type<_1L> local_60;
  extent_type<_1L> local_58;
  difference_type length_bytes;
  uchar *last;
  iterator first;
  array<unsigned_char,_9UL> encoded_length;
  size_type length;
  sstring_view<std::shared_ptr<const_char>_> *str_local;
  database_writer *archive_local;
  archive_result_type<pstore::serialize::archive::database_writer_&> resl;
  
  encoded_length._M_elems._1_8_ = sstring_view<std::shared_ptr<const_char>_>::length(str);
  out = std::begin<std::array<unsigned_char,9ul>>((array<unsigned_char,_9UL> *)((long)&first + 7));
  length_bytes = (difference_type)varint::encode<unsigned_char*>(encoded_length._M_elems._1_8_,out);
  puVar1 = (uchar *)std::distance<unsigned_char*>(out,(uchar *)length_bytes);
  if (0 < (long)puVar1) {
    puVar2 = (uchar *)std::array<unsigned_char,_9UL>::size
                                ((array<unsigned_char,_9UL> *)((long)&first + 7));
    if (puVar1 <= puVar2) {
      if (puVar1 == (uchar *)0x1) {
        puVar2 = (uchar *)(length_bytes + 1);
        *(uchar *)length_bytes = '\0';
        length_bytes = (difference_type)puVar2;
      }
      sVar4 = gsl::make_span<unsigned_char>(out,(uchar *)length_bytes);
      local_60 = sVar4.storage_.super_extent_type<_1L>.size_;
      local_58.size_ = (index_type)sVar4.storage_.data_;
      sVar4.storage_.data_ = puVar2;
      sVar4.storage_.super_extent_type<_1L>.size_ = local_58.size_;
      aVar3 = write<pstore::serialize::archive::database_writer&,unsigned_char,_1l>
                        ((serialize *)archive,(database_writer *)local_60.size_,sVar4);
      sVar5 = gsl::make_span<pstore::sstring_view<std::shared_ptr<char_const>>>(str);
      local_70 = sVar5.storage_.super_extent_type<_1L>.size_;
      local_68.size_ = (index_type)sVar5.storage_.data_;
      sVar5.storage_.data_ = (pointer)puVar2;
      sVar5.storage_.super_extent_type<_1L>.size_ = local_68.size_;
      write<pstore::serialize::archive::database_writer&,char_const,_1l>
                ((serialize *)archive,(database_writer *)local_70.size_,sVar5);
      return (archive_result_type<pstore::serialize::archive::database_writer_&>)aVar3.a_;
    }
  }
  assert_failed("length_bytes > 0 && static_cast<std::size_t> (length_bytes) <= encoded_length.size ()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                ,0x3e);
}

Assistant:

static auto write (Archive && archive, StringType const & str)
                -> archive_result_type<Archive> {
                auto const length = str.length ();

                // Encode the string length as a variable-length integer.
                std::array<std::uint8_t, varint::max_output_length> encoded_length;
                auto first = std::begin (encoded_length);
                auto last = varint::encode (length, first);
                auto length_bytes = std::distance (first, last);
                PSTORE_ASSERT (length_bytes > 0 &&
                               static_cast<std::size_t> (length_bytes) <= encoded_length.size ());
                if (length_bytes == 1) {
                    *(last++) = 0;
                }
                // Emit the string length.
                auto const resl = serialize::write (archive, gsl::make_span (&(*first), &(*last)));

                // Emit the string body.
                serialize::write (archive, gsl::make_span (str));
                return resl;
            }